

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ralocal.cpp
# Opt level: O1

int __thiscall asmjit::RALocalAllocator::init(RALocalAllocator *this,EVP_PKEY_CTX *ctx)

{
  BaseRAPass *this_00;
  byte bVar1;
  uint workId;
  long lVar2;
  long lVar3;
  uint32_t physId;
  uint uVar4;
  PhysToWorkMap *pPVar5;
  WorkToPhysMap *pWVar6;
  byte bVar7;
  uint uVar8;
  int iVar9;
  long lVar10;
  uint uVar11;
  void *__src;
  long lVar12;
  long lVar13;
  uint group;
  uint uVar14;
  BaseRAPass *this_01;
  BaseRAPass *pBVar16;
  ulong uVar17;
  long lVar18;
  int iStack_68;
  uint uStack_64;
  BaseRAPass *pBVar15;
  
  pPVar5 = BaseRAPass::newPhysToWorkMap(this->_pass);
  this_01 = this->_pass;
  pWVar6 = BaseRAPass::newWorkToPhysMap(this_01);
  if (pWVar6 == (WorkToPhysMap *)0x0 || pPVar5 == (PhysToWorkMap *)0x0) {
    return 1;
  }
  if ((this->_curAssignment)._physToWorkMap == (PhysToWorkMap *)0x0) {
    if ((this->_curAssignment)._workToPhysMap != (WorkToPhysMap *)0x0) goto LAB_0011c59a;
    this_01 = this->_pass;
    bVar1 = (this_01->_physRegCount).field_0._regs[0];
    ctx = (EVP_PKEY_CTX *)(ulong)bVar1;
    uVar8 = (uint)(this_01->_physRegCount).field_0._regs[1] + (uint)bVar1;
    if (0xff < uVar8) goto LAB_0011c59f;
    uVar11 = (this_01->_physRegCount).field_0._regs[2] + uVar8;
    if (0xff < uVar11) goto LAB_0011c5a4;
    uVar8 = uVar11 * 0x1000000 | uVar8 * 0x10000 | (uint)bVar1 << 8;
    (this->_curAssignment)._layout.physIndex.super_RARegCount.field_0._packed = uVar8;
    (this->_curAssignment)._layout.physCount.field_0 = (this_01->_physRegCount).field_0;
    uVar11 = (uint)(this->_curAssignment)._layout.physCount.field_0._regs[3] +
             (uint)(this->_curAssignment)._layout.physIndex.super_RARegCount.field_0._regs[3];
    ctx = (EVP_PKEY_CTX *)(ulong)uVar11;
    (this->_curAssignment)._layout.physTotal = uVar11;
    (this->_curAssignment)._layout.workCount = (this_01->_workRegs).super_ZoneVectorBase._size;
    (this->_curAssignment)._layout.workRegs = &this_01->_workRegs;
    (this->_curAssignment)._physToWorkMap = pPVar5;
    (this->_curAssignment)._workToPhysMap = pWVar6;
    lVar10 = 0;
    do {
      *(uint32_t **)((long)(this->_curAssignment)._physToWorkIds + lVar10) =
           pPVar5->workIds + (uVar8 >> ((byte)lVar10 & 0x1f) & 0xff);
      lVar10 = lVar10 + 8;
    } while (lVar10 != 0x20);
    pPVar5 = BaseRAPass::newPhysToWorkMap(this_01);
    this_01 = this->_pass;
    pWVar6 = BaseRAPass::newWorkToPhysMap(this_01);
    if (pWVar6 == (WorkToPhysMap *)0x0 || pPVar5 == (PhysToWorkMap *)0x0) {
      return 1;
    }
    if ((this->_tmpAssignment)._physToWorkMap != (PhysToWorkMap *)0x0) goto LAB_0011c5a9;
    if ((this->_tmpAssignment)._workToPhysMap != (WorkToPhysMap *)0x0) goto LAB_0011c5ae;
    pBVar15 = this->_pass;
    bVar1 = (pBVar15->_physRegCount).field_0._regs[0];
    this_01 = (BaseRAPass *)(ulong)bVar1;
    uVar8 = (uint)(pBVar15->_physRegCount).field_0._regs[1] + (uint)bVar1;
    ctx = (EVP_PKEY_CTX *)(ulong)uVar8;
    if (uVar8 < 0x100) {
      uVar11 = (pBVar15->_physRegCount).field_0._regs[2] + uVar8;
      if (uVar11 < 0x100) {
        uVar8 = uVar11 * 0x1000000 | uVar8 * 0x10000 | (uint)bVar1 << 8;
        (this->_tmpAssignment)._layout.physIndex.super_RARegCount.field_0._packed = uVar8;
        (this->_tmpAssignment)._layout.physCount.field_0 = (pBVar15->_physRegCount).field_0;
        (this->_tmpAssignment)._layout.physTotal =
             (uint)(this->_tmpAssignment)._layout.physCount.field_0._regs[3] +
             (uint)(this->_tmpAssignment)._layout.physIndex.super_RARegCount.field_0._regs[3];
        (this->_tmpAssignment)._layout.workCount = (pBVar15->_workRegs).super_ZoneVectorBase._size;
        (this->_tmpAssignment)._layout.workRegs = &pBVar15->_workRegs;
        (this->_tmpAssignment)._physToWorkMap = pPVar5;
        (this->_tmpAssignment)._workToPhysMap = pWVar6;
        lVar10 = 0;
        do {
          *(uint32_t **)((long)(this->_tmpAssignment)._physToWorkIds + lVar10) =
               pPVar5->workIds + (uVar8 >> ((byte)lVar10 & 0x1f) & 0xff);
          lVar10 = lVar10 + 8;
        } while (lVar10 != 0x20);
        return 0;
      }
      goto LAB_0011c5b8;
    }
  }
  else {
    init((EVP_PKEY_CTX *)this_01);
LAB_0011c59a:
    init((EVP_PKEY_CTX *)this_01);
LAB_0011c59f:
    init((EVP_PKEY_CTX *)this_01);
LAB_0011c5a4:
    init((EVP_PKEY_CTX *)this_01);
LAB_0011c5a9:
    init((EVP_PKEY_CTX *)this_01);
LAB_0011c5ae:
    init((EVP_PKEY_CTX *)this_01);
  }
  init((EVP_PKEY_CTX *)this_01);
LAB_0011c5b8:
  init((EVP_PKEY_CTX *)this_01);
  lVar10 = *(long *)&this_01->super_FuncPass;
  pBVar15 = this_01;
  if (*(int *)(lVar10 + 0xb8) == 0) {
LAB_0011c89b:
    makeInitialAssignment();
    memcpy((pBVar15->_allocator)._slots[7],ctx,
           (ulong)*(uint *)((pBVar15->_allocator)._slots + 4) * 4 + 0x20);
    memcpy((pBVar15->_allocator)._slots[6],__src,
           (ulong)*(uint *)((long)(pBVar15->_allocator)._slots + 0x24));
    return 0;
  }
  lVar2 = *(long *)(lVar10 + 0x98);
  lVar10 = **(long **)(lVar10 + 0xb0);
  bVar1 = *(byte *)(lVar2 + 0xa4);
  this_00 = (BaseRAPass *)((this_01->_allocator)._slots + 3);
  uVar8 = 0;
  uVar11 = 1;
  do {
    if ((ulong)bVar1 == 0) {
      bVar7 = 0;
    }
    else {
      lVar13 = 0;
      uVar17 = 0;
      do {
        lVar18 = 4;
        lVar12 = lVar13;
        uVar4 = uVar11;
        do {
          if (*(byte *)(lVar2 + 0xa4) <= (byte)uVar17) {
            makeInitialAssignment();
LAB_0011c87d:
            makeInitialAssignment();
LAB_0011c882:
            makeInitialAssignment();
LAB_0011c887:
            makeInitialAssignment();
LAB_0011c88c:
            makeInitialAssignment();
LAB_0011c891:
            makeInitialAssignment();
LAB_0011c896:
            makeInitialAssignment();
            goto LAB_0011c89b;
          }
          lVar3 = *(long *)(*(long *)(lVar2 + 0x240) + lVar12 * 2);
          iVar9 = 10;
          uVar11 = uVar4;
          if ((lVar3 == 0) ||
             (pBVar16 = *(BaseRAPass **)(lVar3 + 0x20), pBVar16 == (BaseRAPass *)0x0))
          goto LAB_0011c6b2;
          workId = (((Layout *)&pBVar16->super_FuncPass)->physIndex).super_RARegCount.field_0.
                   _packed;
          if (*(uint *)(lVar10 + 0x80) <= workId) goto LAB_0011c87d;
          ctx = (EVP_PKEY_CTX *)(ulong)(workId >> 6);
          if ((*(ulong *)(*(long *)(lVar10 + 0x78) + (long)ctx * 8) >> ((ulong)workId & 0x3f) & 1)
              == 0) goto LAB_0011c6b2;
          if (workId == 0xffffffff) goto LAB_0011c882;
          if (*(uint *)((long)(this_01->_allocator)._slots + 0x24) <= workId) goto LAB_0011c887;
          if (*(char *)((long)(this_01->_allocator)._slots[6] + (ulong)workId) != -1)
          goto LAB_0011c6b2;
          group = *(uint *)(pBVar16->_allocator)._slots >> 8 & 0xf;
          ctx = (EVP_PKEY_CTX *)(ulong)group;
          if (3 < group) goto LAB_0011c88c;
          uVar14 = ~*(uint *)((long)(this_01->_allocator)._slots[7] + (ulong)(group * 4)) &
                   *(uint *)((long)(this_01->_allocator)._slots + ((ulong)(group * 4) - 8));
          pBVar15 = (BaseRAPass *)(ulong)uVar14;
          if (uVar8 == 0) {
            bVar7 = *(byte *)((long)(pBVar16->_allocator)._slots + 0x1a);
            iVar9 = 0;
            uVar11 = 2;
            if ((bVar7 != 0xff) && ((uVar14 >> (bVar7 & 0x1f) & 1) != 0)) {
              pBVar15 = this_00;
              RAAssignment::assign((RAAssignment *)this_00,group,workId,(uint)bVar7,1);
              if (0xf < uVar17) goto LAB_0011c896;
              *(uint *)(*(long *)&this_01->super_FuncPass + 0x22c + lVar12) =
                   (uint)*(byte *)(*(long *)&((Layout *)&pBVar16->super_FuncPass)->physTotal + 0xd)
                   + ((uint)bVar7 << 0x10 | (*(uint *)(pBVar16->_allocator)._slots & 0xf8) << 0x15)
                   + 0x100;
              iVar9 = 10;
              uVar11 = uVar4;
            }
          }
          else if (uVar14 == 0) {
            ctx = (EVP_PKEY_CTX *)this_01;
            makeInitialAssignment();
            pBVar15 = pBVar16;
            uVar11 = uStack_64;
            iVar9 = iStack_68;
          }
          else {
            physId = 0;
            if (uVar14 != 0) {
              for (; (uVar14 >> physId & 1) == 0; physId = physId + 1) {
              }
            }
            pBVar15 = this_00;
            RAAssignment::assign((RAAssignment *)this_00,group,workId,physId,1);
            if (0xf < uVar17) goto LAB_0011c891;
            *(uint *)(*(long *)&this_01->super_FuncPass + 0x22c + lVar12) =
                 (uint)*(byte *)(*(long *)&((Layout *)&pBVar16->super_FuncPass)->physTotal + 0xd) +
                 (physId << 0x10 | (*(uint *)(pBVar16->_allocator)._slots & 0xf8) << 0x15) + 0x100;
            iVar9 = 0;
          }
LAB_0011c6b2:
          if ((iVar9 != 10) && (iVar9 != 0)) {
            bVar7 = 0;
            goto LAB_0011c82c;
          }
          lVar12 = lVar12 + 4;
          lVar18 = lVar18 + -1;
          uVar4 = uVar11;
        } while (lVar18 != 0);
        bVar7 = 1;
LAB_0011c82c:
        if (bVar7 == 0) break;
        uVar17 = uVar17 + 1;
        lVar13 = lVar13 + 0x10;
      } while (uVar17 != bVar1);
      bVar7 = bVar7 ^ 1;
    }
    if ((bVar7 != 0) || (uVar8 = uVar8 + 1, uVar11 <= uVar8)) {
      return (int)bVar7;
    }
  } while( true );
}

Assistant:

Error RALocalAllocator::init() noexcept {
  PhysToWorkMap* physToWorkMap;
  WorkToPhysMap* workToPhysMap;

  physToWorkMap = _pass->newPhysToWorkMap();
  workToPhysMap = _pass->newWorkToPhysMap();
  if (!physToWorkMap || !workToPhysMap)
    return DebugUtils::errored(kErrorOutOfMemory);

  _curAssignment.initLayout(_pass->_physRegCount, _pass->workRegs());
  _curAssignment.initMaps(physToWorkMap, workToPhysMap);

  physToWorkMap = _pass->newPhysToWorkMap();
  workToPhysMap = _pass->newWorkToPhysMap();
  if (!physToWorkMap || !workToPhysMap)
    return DebugUtils::errored(kErrorOutOfMemory);

  _tmpAssignment.initLayout(_pass->_physRegCount, _pass->workRegs());
  _tmpAssignment.initMaps(physToWorkMap, workToPhysMap);

  return kErrorOk;
}